

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool __thiscall
wabt::WastParser::ParseTextListOpt
          (WastParser *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  pointer *ppuVar1;
  uchar uVar2;
  byte c;
  pointer psVar3;
  TokenType TVar4;
  Result RVar5;
  string_view *__args;
  uchar *puVar6;
  iterator iVar7;
  pointer psVar8;
  uchar *puVar9;
  uint32_t hi;
  uint32_t lo;
  TextVector texts;
  byte local_b1;
  string_view local_b0;
  uint32_t local_9c;
  vector<wabt::string_view,_std::allocator<wabt::string_view>_> local_98;
  string_view *local_78;
  Token local_70;
  uchar *puVar10;
  
  local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
  super__Vector_impl_data._M_start = (string_view *)0x0;
  local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
  super__Vector_impl_data._M_finish = (string_view *)0x0;
  local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (string_view *)0x0;
  TVar4 = Peek(this,0);
  if (TVar4 == Text) {
    do {
      Consume(&local_70,this);
      if (5 < local_70.token_type_ - AlignEqNat) {
        __assert_fail("HasText()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/token.h"
                      ,0x62,"string_view wabt::Token::text() const");
      }
      local_b0.data_ = local_70.field_2.text_.data_;
      local_b0.size_ = local_70.field_2.text_.size_;
      if (local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl
          .super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage) {
        std::vector<wabt::string_view,_std::allocator<wabt::string_view>_>::
        _M_realloc_insert<wabt::string_view>
                  (&local_98,
                   (iterator)
                   local_98.
                   super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl
                   .super__Vector_impl_data._M_finish,&local_b0);
      }
      else {
        (local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
         super__Vector_impl_data._M_finish)->data_ = local_70.field_2.text_.data_;
        (local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
         super__Vector_impl_data._M_finish)->size_ = local_70.field_2.text_.size_;
        local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
             _M_impl.super__Vector_impl_data._M_finish + 1;
      }
      TVar4 = Peek(this,0);
    } while (TVar4 == Text);
    local_78 = local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      psVar8 = local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        local_70.loc.filename = *psVar8;
        if (2 < psVar8->size_) {
          local_70.loc.filename = string_view::substr((string_view *)&local_70,1,psVar8->size_ - 2);
          puVar9 = (uchar *)local_70.loc.filename.data_;
          if (0 < (long)local_70.loc.filename.size_) {
            puVar6 = puVar9 + local_70.loc.filename.size_;
            do {
              uVar2 = *puVar9;
              if (uVar2 == '\\') {
                puVar10 = puVar9 + 1;
                c = puVar9[1];
                if (c < 0x6e) {
                  if (c == 0x22) {
                    local_b0.data_ = (char *)CONCAT71(local_b0.data_._1_7_,0x22);
                    iVar7._M_current =
                         (out_data->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar7._M_current !=
                        (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      *iVar7._M_current = '\"';
LAB_0016d558:
                      ppuVar1 = &(out_data->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish;
                      *ppuVar1 = *ppuVar1 + 1;
                      goto LAB_0016d56c;
                    }
                  }
                  else if (c == 0x27) {
                    local_b0.data_ = (char *)CONCAT71(local_b0.data_._1_7_,0x27);
                    iVar7._M_current =
                         (out_data->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar7._M_current !=
                        (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      *iVar7._M_current = '\'';
                      goto LAB_0016d558;
                    }
                  }
                  else {
                    if (c != 0x5c) {
LAB_0016d4e4:
                      RVar5 = ParseHexdigit(c,(uint32_t *)&local_b0);
                      if ((RVar5.enum_ != Ok) ||
                         (RVar5 = ParseHexdigit(puVar9[2],&local_9c), RVar5.enum_ != Ok)) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/wast-parser.cc"
                                      ,0x58,
                                      "void wabt::(anonymous namespace)::RemoveEscapes(string_view, OutputIter) [OutputIter = std::back_insert_iterator<std::vector<unsigned char>>]"
                                     );
                      }
                      puVar9 = puVar9 + 2;
                      local_b1 = (byte)((int)local_b0.data_ << 4) | (byte)local_9c;
                      iVar7._M_current =
                           (out_data->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish;
                      if (iVar7._M_current ==
                          (out_data->
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                          .super__Vector_impl_data._M_end_of_storage) {
                        __args = (string_view *)&local_b1;
                        goto LAB_0016d4ab;
                      }
                      *iVar7._M_current = local_b1;
                      goto LAB_0016d46e;
                    }
                    local_b0.data_ = (char *)CONCAT71(local_b0.data_._1_7_,0x5c);
                    iVar7._M_current =
                         (out_data->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
                    if (iVar7._M_current !=
                        (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      *iVar7._M_current = '\\';
                      goto LAB_0016d558;
                    }
                  }
                }
                else if (c == 0x74) {
                  local_b0.data_ = (char *)CONCAT71(local_b0.data_._1_7_,9);
                  iVar7._M_current =
                       (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar7._M_current !=
                      (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    *iVar7._M_current = '\t';
                    goto LAB_0016d558;
                  }
                }
                else if (c == 0x72) {
                  local_b0.data_ = (char *)CONCAT71(local_b0.data_._1_7_,0xd);
                  iVar7._M_current =
                       (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar7._M_current !=
                      (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    *iVar7._M_current = '\r';
                    goto LAB_0016d558;
                  }
                }
                else {
                  if (c != 0x6e) goto LAB_0016d4e4;
                  local_b0.data_ = (char *)CONCAT71(local_b0.data_._1_7_,10);
                  iVar7._M_current =
                       (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
                  if (iVar7._M_current !=
                      (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    *iVar7._M_current = '\n';
                    goto LAB_0016d558;
                  }
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                _M_realloc_insert<unsigned_char>(out_data,iVar7,(uchar *)&local_b0);
              }
              else {
                local_b0.data_ = (char *)CONCAT71(local_b0.data_._1_7_,uVar2);
                iVar7._M_current =
                     (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
                __args = &local_b0;
                if (iVar7._M_current ==
                    (out_data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0016d4ab:
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  _M_realloc_insert<unsigned_char>(out_data,iVar7,(uchar *)__args);
                  puVar10 = puVar9;
                }
                else {
                  *iVar7._M_current = uVar2;
LAB_0016d46e:
                  ppuVar1 = &(out_data->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppuVar1 = *ppuVar1 + 1;
                  puVar10 = puVar9;
                }
              }
LAB_0016d56c:
              puVar9 = puVar10 + 1;
            } while (puVar9 < puVar6);
          }
        }
        psVar8 = psVar8 + 1;
      } while (psVar8 != local_78);
    }
    psVar3 = local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    psVar8 = local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
        super__Vector_impl_data._M_start != (string_view *)0x0) {
      operator_delete(local_98.
                      super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      local_98.super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl.
      super__Vector_impl_data._M_finish = psVar3;
      goto LAB_0016d5b7;
    }
  }
  psVar8 = (string_view *)0x0;
LAB_0016d5b7:
  return psVar8 != local_98.
                   super__Vector_base<wabt::string_view,_std::allocator<wabt::string_view>_>._M_impl
                   .super__Vector_impl_data._M_finish;
}

Assistant:

bool WastParser::ParseTextListOpt(std::vector<uint8_t>* out_data) {
  WABT_TRACE(ParseTextListOpt);
  TextVector texts;
  while (PeekMatch(TokenType::Text))
    texts.push_back(Consume().text());

  RemoveEscapes(texts, std::back_inserter(*out_data));
  return !texts.empty();
}